

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall VmaMappingHysteresis::PostMap(VmaMappingHysteresis *this)

{
  VmaMappingHysteresis *in_RDI;
  
  if (in_RDI->m_ExtraMapping == 0) {
    in_RDI->m_MajorCounter = in_RDI->m_MajorCounter + 1;
    if (6 < in_RDI->m_MajorCounter) {
      in_RDI->m_ExtraMapping = 1;
      in_RDI->m_MajorCounter = 0;
      in_RDI->m_MinorCounter = 0;
      return true;
    }
  }
  else {
    PostMinorCounter(in_RDI);
  }
  return false;
}

Assistant:

bool PostMap()
    {
#if VMA_MAPPING_HYSTERESIS_ENABLED
        if(m_ExtraMapping == 0)
        {
            ++m_MajorCounter;
            if(m_MajorCounter >= COUNTER_MIN_EXTRA_MAPPING)
            {
                m_ExtraMapping = 1;
                m_MajorCounter = 0;
                m_MinorCounter = 0;
                return true;
            }
        }
        else // m_ExtraMapping == 1
            PostMinorCounter();
#endif // #if VMA_MAPPING_HYSTERESIS_ENABLED
        return false;
    }